

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_buffer_header(void *buf,size_t bufsiz,char *fid)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 5;
  if (((((ulong)buf & 3) != 0) || (iVar2 = 6, 0x1ffffffe < bufsiz >> 3)) || (iVar2 = 1, bufsiz < 8))
  {
    return iVar2;
  }
  if (fid != (char *)0x0) {
    bVar1 = *fid;
    uVar3 = (uint)bVar1;
    if (bVar1 != 0) {
      if (fid[1] != '\0') {
        uVar3 = (uint)CONCAT11(fid[1],bVar1);
        if (fid[2] != 0) {
          uVar3 = uVar3 | (uint)(byte)fid[3] << 0x18 | (uint)(byte)fid[2] << 0x10;
        }
      }
      if (*(uint *)((long)buf + 4) != uVar3) {
        return 2;
      }
    }
  }
  return 0;
}

Assistant:

int flatcc_verify_buffer_header(const void *buf, size_t bufsiz, const char *fid)
{
    thash_t id, id2;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);
    /*
     * Even if we specify no fid, the user might later. Therefore
     * require space for it. Not all buffer generators will take this
     * into account, so it is possible to fail an otherwise valid buffer
     * - but such buffers aren't safe.
     */
    verify(bufsiz >= offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    return flatcc_verify_ok;
}